

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void freeSearchPath(void)

{
  __PHYSFS_DIRHANDLE__ *p_Var1;
  DirHandle *next;
  DirHandle *i;
  
  closeFileHandleList(&openReadList);
  if (searchPath != (DirHandle *)0x0) {
    next = searchPath;
    while (next != (DirHandle *)0x0) {
      p_Var1 = next->next;
      freeDirHandle(next,openReadList);
      next = p_Var1;
    }
    searchPath = (DirHandle *)0x0;
  }
  return;
}

Assistant:

static void freeSearchPath(void)
{
    DirHandle *i;
    DirHandle *next = NULL;

    closeFileHandleList(&openReadList);

    if (searchPath != NULL)
    {
        for (i = searchPath; i != NULL; i = next)
        {
            next = i->next;
            freeDirHandle(i, openReadList);
        } /* for */
        searchPath = NULL;
    } /* if */
}